

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSources::ProcessRawPacket
          (RTPSources *this,RTPRawPacket *rawpack,RTPTransmitter **rtptrans,int numtrans,
          bool acceptownpackets)

{
  int iVar1;
  RTPPacket *this_00;
  _func_int **pp_Var2;
  RTPAddress *pRVar3;
  RTPMemoryManager *pRVar4;
  ulong uVar5;
  bool bVar6;
  bool stored;
  RTCPCompoundPacket rtcpcomppack;
  RTPTime local_90;
  RTPPacket *local_88;
  RTCPCompoundPacket local_80;
  
  if (rawpack->isrtp != true) {
    RTCPCompoundPacket::RTCPCompoundPacket(&local_80,rawpack,(this->super_RTPMemoryObject).mgr);
    if (local_80.error < 0) {
      iVar1 = local_80.error;
      if (local_80.error != -0x1e) goto LAB_0011d259;
      goto LAB_0011d2d8;
    }
    pRVar3 = rawpack->senderaddress;
    if (numtrans < 1) {
LAB_0011d2b3:
      local_90.m_t = (rawpack->receivetime).m_t;
      iVar1 = ProcessRTCPCompoundPacket(this,&local_80,&local_90,pRVar3);
    }
    else {
      uVar5 = 1;
      do {
        iVar1 = (*(rtptrans[uVar5 - 1]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                          (rtptrans[uVar5 - 1],pRVar3);
        bVar6 = uVar5 < (uint)numtrans;
        uVar5 = uVar5 + 1;
      } while (bVar6 && (char)iVar1 == '\0');
      if ((char)iVar1 == '\0') {
        pRVar3 = rawpack->senderaddress;
        goto LAB_0011d2b3;
      }
      if (!acceptownpackets) goto LAB_0011d2d8;
      local_90.m_t = (rawpack->receivetime).m_t;
      iVar1 = ProcessRTCPCompoundPacket(this,&local_80,&local_90,(RTPAddress *)0x0);
    }
    if (iVar1 < 0) {
LAB_0011d259:
      RTCPCompoundPacket::~RTCPCompoundPacket(&local_80);
      return iVar1;
    }
LAB_0011d2d8:
    RTCPCompoundPacket::~RTCPCompoundPacket(&local_80);
    return 0;
  }
  pRVar4 = (this->super_RTPMemoryObject).mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    this_00 = (RTPPacket *)operator_new(0x78);
  }
  else {
    this_00 = (RTPPacket *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,0x78,0x19);
  }
  RTPPacket::RTPPacket(this_00,rawpack,(this->super_RTPMemoryObject).mgr);
  iVar1 = this_00->error;
  if (iVar1 < 0) {
    pRVar4 = (this->super_RTPMemoryObject).mgr;
    pp_Var2 = (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject;
    if (iVar1 != -0x19) goto LAB_0011d297;
    goto LAB_0011d274;
  }
  local_90.m_t = local_90.m_t & 0xffffffffffffff00;
  pRVar3 = rawpack->senderaddress;
  if (numtrans < 1) {
LAB_0011d215:
    local_80.super_RTPMemoryObject._vptr_RTPMemoryObject = (_func_int **)(rawpack->receivetime).m_t;
LAB_0011d232:
    iVar1 = ProcessRTPPacket(this,this_00,(RTPTime *)&local_80,pRVar3,(bool *)&local_90);
    if (iVar1 < 0) {
      if (((ulong)local_90.m_t & 1) != 0) {
        return iVar1;
      }
      pRVar4 = (this->super_RTPMemoryObject).mgr;
      pp_Var2 = (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject;
LAB_0011d297:
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        (*pp_Var2[1])(this_00);
        return iVar1;
      }
      (**pp_Var2)(this_00);
      (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,this_00);
      return iVar1;
    }
    if (((ulong)local_90.m_t & 1) != 0) {
      return 0;
    }
  }
  else {
    uVar5 = 1;
    local_88 = this_00;
    do {
      iVar1 = (*(rtptrans[uVar5 - 1]->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])
                        (rtptrans[uVar5 - 1],pRVar3);
      if ((char)iVar1 != '\0') break;
      bVar6 = uVar5 < (uint)numtrans;
      uVar5 = uVar5 + 1;
    } while (bVar6);
    this_00 = local_88;
    if ((char)iVar1 == '\0') goto LAB_0011d215;
    if (acceptownpackets) {
      local_80.super_RTPMemoryObject._vptr_RTPMemoryObject =
           (_func_int **)(rawpack->receivetime).m_t;
      pRVar3 = (RTPAddress *)0x0;
      goto LAB_0011d232;
    }
  }
  pRVar4 = (this->super_RTPMemoryObject).mgr;
  pp_Var2 = (this_00->super_RTPMemoryObject)._vptr_RTPMemoryObject;
LAB_0011d274:
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    (*pp_Var2[1])(this_00);
  }
  else {
    (**pp_Var2)(this_00);
    (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,this_00);
  }
  return 0;
}

Assistant:

int RTPSources::ProcessRawPacket(RTPRawPacket *rawpack,RTPTransmitter *rtptrans[],int numtrans,bool acceptownpackets)
{
	int status;
	
	if (rawpack->IsRTP()) // RTP packet
	{
		RTPPacket *rtppack;
		
		// First, we'll see if the packet can be parsed
		rtppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPPACKET) RTPPacket(*rawpack,GetMemoryManager());
		if (rtppack == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = rtppack->GetCreationError()) < 0)
		{
			if (status == ERR_RTP_PACKET_INVALIDPACKET)
			{
				RTPDelete(rtppack,GetMemoryManager());
				rtppack = 0;
			}
			else
			{
				RTPDelete(rtppack,GetMemoryManager());
				return status;
			}
		}
				
		// Check if the packet was valid
		if (rtppack != 0)
		{
			bool stored = false;
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}
			
			// Check if the packet is our own.
			if (ownpacket)
			{
				// Now it depends on the user's preference
				// what to do with this packet:
				if (acceptownpackets)
				{
					// sender addres for own packets has to be NULL!
					if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),0,&stored)) < 0)
					{
						if (!stored)
							RTPDelete(rtppack,GetMemoryManager());
						return status;
					}
				}
			}
			else 
			{
				if ((status = ProcessRTPPacket(rtppack,rawpack->GetReceiveTime(),senderaddress,&stored)) < 0)
				{
					if (!stored)
						RTPDelete(rtppack,GetMemoryManager());
					return status;
				}
			}
			if (!stored)
				RTPDelete(rtppack,GetMemoryManager());
		}
	}
	else // RTCP packet
	{
		RTCPCompoundPacket rtcpcomppack(*rawpack,GetMemoryManager());
		bool valid = false;
		
		if ((status = rtcpcomppack.GetCreationError()) < 0)
		{
			if (status != ERR_RTP_RTCPCOMPOUND_INVALIDPACKET)
				return status;
		}
		else
			valid = true;


		if (valid)
		{
			bool ownpacket = false;
			int i;
			const RTPAddress *senderaddress = rawpack->GetSenderAddress();

			for (i = 0 ; !ownpacket && i < numtrans ; i++)
			{
				if (rtptrans[i]->ComesFromThisTransmitter(senderaddress))
					ownpacket = true;
			}

			// First check if it's a packet of this session.
			if (ownpacket)
			{
				if (acceptownpackets)
				{
					// sender address for own packets has to be NULL
					status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),0);
					if (status < 0)
						return status;
				}
			}
			else // not our own packet
			{
				status = ProcessRTCPCompoundPacket(&rtcpcomppack,rawpack->GetReceiveTime(),rawpack->GetSenderAddress());
				if (status < 0)
					return status;
			}
		}
	}
	
	return 0;
}